

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O1

mi_page_t *
mi_page_fresh_alloc(mi_heap_t *heap,mi_page_queue_t *pq,size_t block_size,size_t page_alignment)

{
  mi_tld_t *page;
  long lVar1;
  ulong in_RAX;
  mi_heap_t *heap_00;
  uint8_t *puVar2;
  undefined1 uVar3;
  mi_segment_t *segment;
  size_t page_size;
  ulong local_38;
  
  local_38 = in_RAX;
  heap_00 = (mi_heap_t *)_mi_segment_page_alloc(heap,block_size,page_alignment,&heap->tld->segments)
  ;
  if (heap_00 == (mi_heap_t *)0x0) {
    heap_00 = (mi_heap_t *)0x0;
  }
  else {
    if ((pq == (mi_page_queue_t *)0x0) || (((ulong)heap_00->thread_delayed_free & 4) != 0)) {
      block_size = heap_00->keys[0];
    }
    page = heap->tld;
    segment = (mi_segment_t *)
              ((ulong)((long)&heap_00[-1].pages[0x4a].block_size + 7) & 0xfffffffffe000000);
    if ((long)segment < 1) {
      segment = (mi_segment_t *)0x0;
    }
    *(mi_heap_t **)((heap_00->random).input + 2) = heap;
    *(uint8_t *)((long)&heap_00->cookie + 3) = heap->tag;
    heap_00->keys[0] = block_size;
    puVar2 = _mi_segment_page_start(segment,(mi_page_t *)heap_00,&local_38);
    heap_00->keys[1] = (uintptr_t)puVar2;
    *(short *)((long)&heap_00->thread_delayed_free + 4) = (short)(local_38 / block_size);
    *(byte *)((long)&heap_00->thread_delayed_free + 7) =
         *(byte *)((long)&heap_00->thread_delayed_free + 7) & 0xfe |
         *(byte *)&heap_00->thread_delayed_free >> 1 & 1;
    lVar1 = 0;
    if (block_size != 0) {
      for (; (block_size >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar3 = (undefined1)lVar1;
    if ((block_size & block_size - 1) != 0) {
      uVar3 = 0;
    }
    *(undefined1 *)((long)&heap_00->cookie + 2) = uVar3;
    mi_page_extend_free(heap_00,(mi_page_t *)page,(mi_tld_t *)(local_38 % block_size));
    if (pq != (mi_page_queue_t *)0x0) {
      mi_page_queue_push(heap,pq,(mi_page_t *)heap_00);
    }
  }
  return (mi_page_t *)heap_00;
}

Assistant:

static mi_page_t* mi_page_fresh_alloc(mi_heap_t* heap, mi_page_queue_t* pq, size_t block_size, size_t page_alignment) {
  #if !MI_HUGE_PAGE_ABANDON
  mi_assert_internal(pq != NULL);
  mi_assert_internal(mi_heap_contains_queue(heap, pq));
  mi_assert_internal(page_alignment > 0 || block_size > MI_MEDIUM_OBJ_SIZE_MAX || block_size == pq->block_size);
  #endif
  mi_page_t* page = _mi_segment_page_alloc(heap, block_size, page_alignment, &heap->tld->segments);
  if (page == NULL) {
    // this may be out-of-memory, or an abandoned page was reclaimed (and in our queue)
    return NULL;
  }
  #if MI_HUGE_PAGE_ABANDON
  mi_assert_internal(pq==NULL || _mi_page_segment(page)->page_kind != MI_PAGE_HUGE);
  #endif
  mi_assert_internal(page_alignment >0 || block_size > MI_MEDIUM_OBJ_SIZE_MAX || _mi_page_segment(page)->kind != MI_SEGMENT_HUGE);
  mi_assert_internal(pq!=NULL || mi_page_block_size(page) >= block_size);
  // a fresh page was found, initialize it
  const size_t full_block_size = (pq == NULL || mi_page_is_huge(page) ? mi_page_block_size(page) : block_size); // see also: mi_segment_huge_page_alloc
  mi_assert_internal(full_block_size >= block_size);
  mi_page_init(heap, page, full_block_size, heap->tld);
  mi_heap_stat_increase(heap, pages, 1);
  mi_heap_stat_increase(heap, page_bins[mi_page_bin(page)], 1);
  if (pq != NULL) { mi_page_queue_push(heap, pq, page); }
  mi_assert_expensive(_mi_page_is_valid(page));
  return page;
}